

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

shared_ptr<mocker::ast::Type> __thiscall
mocker::Parser::type(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  Token *this_01;
  TokIter TVar1;
  TokIter TVar2;
  TokenID TVar3;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  Token *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  Token *this_02;
  shared_ptr<mocker::ast::NonarrayType> sVar5;
  __shared_ptr<mocker::ast::ArrayType,_(__gnu_cxx::_Lock_policy)2> _Var6;
  shared_ptr<mocker::ast::Type> sVar7;
  Position beg;
  Position end_00;
  shared_ptr<mocker::ast::Type> res;
  Token *local_a0;
  Token *pTStack_98;
  Parser local_88;
  Parser local_70 [2];
  size_t local_40;
  shared_ptr<mocker::ast::Type> *local_38;
  
  this_00 = *end._M_current;
  sVar5 = nonarrayType(local_70,iter,end);
  _Var4 = sVar5.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  _Var6._M_refcount._M_pi = _Var4._M_pi;
  _Var6._M_ptr = (element_type *)local_70[0].tokBeg._M_current;
  local_a0 = local_70[0].tokBeg._M_current;
  pTStack_98 = local_70[0].tokEnd._M_current;
  if (local_70[0].tokBeg._M_current != (Token *)0x0) {
    while( true ) {
      this_01 = pTStack_98;
      _Var4 = _Var6._M_refcount._M_pi;
      if (*end._M_current == in_RCX) {
        TVar3 = Error;
      }
      else {
        TVar3 = Token::tokenID(*end._M_current);
        _Var4._M_pi = extraout_RDX;
      }
      if (TVar3 != LeftBracket) {
        (this->tokBeg)._M_current = local_a0;
        (this->tokEnd)._M_current = (Token *)0x0;
        pTStack_98 = (Token *)0x0;
        (this->tokEnd)._M_current = this_01;
        goto LAB_0017fbc6;
      }
      this_02 = (Token *)(*(long *)end._M_current + 0x38);
      *(Token **)end._M_current = this_02;
      if (this_02 == in_RCX) {
        TVar3 = Error;
      }
      else {
        TVar3 = Token::tokenID(this_02);
        _Var4._M_pi = extraout_RDX_00;
      }
      if (TVar3 != RightBracket) break;
      Token::position(this_00);
      TVar2._M_current = local_70[0].tokEnd._M_current;
      TVar1._M_current = local_70[0].tokBeg._M_current;
      Token::position(*end._M_current);
      beg.col = (size_t)TVar1._M_current;
      beg.line = (size_t)iter;
      end_00.col = local_40;
      end_00.line = (size_t)TVar2._M_current;
      _Var6 = (__shared_ptr<mocker::ast::ArrayType,_(__gnu_cxx::_Lock_policy)2>)
              makeNode<mocker::ast::ArrayType,std::shared_ptr<mocker::ast::Type>&>
                        (&local_88,beg,end_00,local_38);
      pTStack_98 = local_88.tokEnd._M_current;
      local_a0 = local_88.tokBeg._M_current;
      local_88.tokBeg._M_current = (Token *)0x0;
      local_88.tokEnd._M_current = (Token *)0x0;
      if (this_01 != (Token *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        _Var6._M_refcount._M_pi = extraout_RDX_01._M_pi;
        _Var6._M_ptr = extraout_RAX;
      }
      if (local_88.tokEnd._M_current != (Token *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.tokEnd._M_current);
        _Var6._M_refcount._M_pi = extraout_RDX_02._M_pi;
        _Var6._M_ptr = extraout_RAX_00;
      }
      *(long *)end._M_current = *(long *)end._M_current + 0x38;
    }
    *(Token **)end._M_current = this_00;
  }
  (this->tokBeg)._M_current = (Token *)0x0;
  (this->tokEnd)._M_current = (Token *)0x0;
LAB_0017fbc6:
  if (pTStack_98 != (Token *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTStack_98);
    _Var4._M_pi = extraout_RDX_03;
  }
  sVar7.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar7.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Type>)
         sVar7.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Type> Parser::type(TokIter &iter, TokIter end) {
  auto beg = iter;
  std::shared_ptr<ast::Type> res = nonarrayType(iter, end);
  if (!res)
    return nullptr;

  auto id = GetTokenID(end);
  while (id(iter) == TokenID::LeftBracket) {
    ++iter;
    if (id(iter) != TokenID::RightBracket) {
      iter = beg;
      return nullptr;
    }
    res = makeNode<ast::ArrayType>(beg->position().first,
                                   iter->position().second, res);
    ++iter;
  }
  return res;
}